

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O1

void __thiscall
tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
          (ConstPixelBufferAccess *this,TextureFormat *format,IVec3 *size,void *data)

{
  int iVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  
  this->m_format = *format;
  lVar3 = 2;
  do {
    (this->m_size).m_data[lVar3 + -2] = size->m_data[lVar3 + -2];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  iVar2 = getPixelSize(this->m_format);
  iVar4 = (this->m_size).m_data[0] * iVar2;
  iVar1 = (this->m_size).m_data[1];
  (this->m_pitch).m_data[0] = iVar2;
  (this->m_pitch).m_data[1] = iVar4;
  (this->m_pitch).m_data[2] = iVar1 * iVar4;
  this->m_data = data;
  return;
}

Assistant:

ConstPixelBufferAccess::ConstPixelBufferAccess (const TextureFormat& format, const IVec3& size, const void* data)
	: m_format		(format)
	, m_size		(size)
	, m_pitch		(calculatePackedPitch(m_format, m_size))
	, m_data		((void*)data)
{
	DE_ASSERT(isValid(format));
}